

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::anon_unknown_1::UniformCollection::addUniform
          (UniformCollection *this,Uniform *uniform)

{
  pointer *ppUVar1;
  Uniform *__first;
  Uniform *__last;
  _Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Uniform>_>
  *this_00;
  pointer __result;
  Uniform *pUVar2;
  Uniform *pUVar3;
  long lVar4;
  Uniform *__alloc;
  char *in_RDX;
  
  pUVar3 = (this->m_uniforms).
           super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Uniform>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pUVar3 == (this->m_uniforms).
                super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Uniform>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    pUVar2 = uniform;
    this_00 = (_Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Uniform>_>
               *)std::
                 vector<deqp::gles2::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Uniform>_>
                 ::_M_check_len(&this->m_uniforms,(size_type)uniform,in_RDX);
    __first = (this->m_uniforms).
              super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Uniform>_>
              ._M_impl.super__Vector_impl_data._M_start;
    __last = (this->m_uniforms).
             super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Uniform>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    __alloc = __last;
    __result = std::
               _Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Uniform>_>
               ::_M_allocate(this_00,(size_t)pUVar2);
    Uniform::Uniform((Uniform *)(((long)pUVar3 - (long)__first) + (long)__result),uniform);
    pUVar2 = std::
             __uninitialized_move_if_noexcept_a<deqp::gles2::Functional::(anonymous_namespace)::Uniform*,deqp::gles2::Functional::(anonymous_namespace)::Uniform*,std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Uniform>>
                       (__first,pUVar3,__result,
                        (allocator<deqp::gles2::Functional::(anonymous_namespace)::Uniform> *)
                        __alloc);
    pUVar3 = std::
             __uninitialized_move_if_noexcept_a<deqp::gles2::Functional::(anonymous_namespace)::Uniform*,deqp::gles2::Functional::(anonymous_namespace)::Uniform*,std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Uniform>>
                       (pUVar3,__last,pUVar2 + 1,
                        (allocator<deqp::gles2::Functional::(anonymous_namespace)::Uniform> *)
                        __alloc);
    std::_Destroy<deqp::gles2::Functional::(anonymous_namespace)::Uniform*>(__first,__last);
    lVar4 = (long)(this->m_uniforms).
                  super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Uniform>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)__first;
    std::
    _Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Uniform>_>
    ::_M_deallocate((_Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Uniform>_>
                     *)__first,(pointer)(lVar4 / 0x38),lVar4 % 0x38);
    (this->m_uniforms).
    super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Uniform>_>
    ._M_impl.super__Vector_impl_data._M_start = __result;
    (this->m_uniforms).
    super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Uniform>_>
    ._M_impl.super__Vector_impl_data._M_finish = pUVar3;
    (this->m_uniforms).
    super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Uniform>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + (long)this_00;
  }
  else {
    Uniform::Uniform(pUVar3,uniform);
    ppUVar1 = &(this->m_uniforms).
               super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Uniform>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppUVar1 = *ppUVar1 + 1;
  }
  return;
}

Assistant:

void				addUniform			(const Uniform& uniform)		{ m_uniforms.push_back(uniform);	}